

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface.hh
# Opt level: O3

void __thiscall
kratos::InterfaceDefinition::InterfaceDefinition(InterfaceDefinition *this,string *name)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  _Rb_tree_header *p_Var3;
  pointer pcVar4;
  undefined8 uVar5;
  
  (this->super_enable_shared_from_this<kratos::InterfaceDefinition>)._M_weak_this.
  super___weak_ptr<kratos::InterfaceDefinition,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->super_enable_shared_from_this<kratos::InterfaceDefinition>)._M_weak_this.
  super___weak_ptr<kratos::InterfaceDefinition,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_IDefinition)._vptr_IDefinition = (_func_int **)&PTR_has_port_002d9558;
  paVar1 = &(this->name_).field_2;
  (this->name_)._M_dataplus._M_p = (pointer)paVar1;
  pcVar4 = (name->_M_dataplus)._M_p;
  paVar2 = &name->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 == paVar2) {
    uVar5 = *(undefined8 *)((long)&name->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->name_).field_2 + 8) = uVar5;
  }
  else {
    (this->name_)._M_dataplus._M_p = pcVar4;
    (this->name_).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->name_)._M_string_length = name->_M_string_length;
  (name->_M_dataplus)._M_p = (pointer)paVar2;
  name->_M_string_length = 0;
  (name->field_2)._M_local_buf[0] = '\0';
  p_Var3 = &(this->ports_)._M_t._M_impl.super__Rb_tree_header;
  (this->ports_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->ports_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->ports_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var3->_M_header;
  (this->ports_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var3->_M_header;
  (this->ports_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var3 = &(this->vars_)._M_t._M_impl.super__Rb_tree_header;
  (this->vars_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->vars_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->vars_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var3->_M_header;
  (this->vars_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var3->_M_header;
  (this->vars_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var3 = &(this->mod_ports_)._M_t._M_impl.super__Rb_tree_header;
  (this->mod_ports_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->mod_ports_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->mod_ports_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var3->_M_header;
  (this->mod_ports_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var3->_M_header;
  (this->mod_ports_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

explicit InterfaceDefinition(std::string name) : name_(std::move(name)) {}